

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesEngineGetActivityExt
          (zes_engine_handle_t hEngine,uint32_t *pCount,zes_engine_stats_t *pStats)

{
  zes_pfnEngineGetActivityExt_t pfnGetActivityExt;
  ze_result_t result;
  zes_engine_stats_t *pStats_local;
  uint32_t *pCount_local;
  zes_engine_handle_t hEngine_local;
  
  pfnGetActivityExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cca8 != (code *)0x0) {
    pfnGetActivityExt._4_4_ = (*DAT_0011cca8)(hEngine,pCount,pStats);
  }
  return pfnGetActivityExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesEngineGetActivityExt(
        zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
        uint32_t* pCount,                               ///< [in,out] Pointer to the number of VF engine stats descriptors.
                                                        ///<  - if count is zero, the driver shall update the value with the total
                                                        ///< number of engine stats available.
                                                        ///<  - if count is greater than the total number of engine stats
                                                        ///< available, the driver shall update the value with the correct number
                                                        ///< of engine stats available.
                                                        ///<  - The count returned is the sum of number of VF instances currently
                                                        ///< available and the PF instance.
        zes_engine_stats_t* pStats                      ///< [in,out][optional][range(0, *pCount)] array of engine group activity counters.
                                                        ///<  - if count is less than the total number of engine stats available,
                                                        ///< then driver shall only retrieve that number of stats.
                                                        ///<  - the implementation shall populate the vector with engine stat for
                                                        ///< PF at index 0 of the vector followed by user provided pCount-1 number
                                                        ///< of VF engine stats.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetActivityExt = context.zesDdiTable.Engine.pfnGetActivityExt;
        if( nullptr != pfnGetActivityExt )
        {
            result = pfnGetActivityExt( hEngine, pCount, pStats );
        }
        else
        {
            // generic implementation
        }

        return result;
    }